

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O2

RawTransactionResponseStruct *
cfd::js::api::ElementsTransactionStructApi::AddPubkeyHashSign
          (RawTransactionResponseStruct *__return_storage_ptr__,
          AddPubkeyHashSignRequestStruct *request)

{
  string *in_R8;
  allocator local_119;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddPubkeyHashSignRequestStruct_&)>
  local_f8;
  RawTransactionResponseStruct local_d8;
  
  RawTransactionResponseStruct::RawTransactionResponseStruct(__return_storage_ptr__);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddPubkeyHashSignRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:907:20)>
              ::_M_invoke;
  local_108 = std::
              _Function_handler<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddPubkeyHashSignRequestStruct_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_elements_transaction.cpp:907:20)>
              ::_M_manager;
  std::__cxx11::string::string((string *)&local_f8,"AddPubkeyHashSign",&local_119);
  ExecuteStructApi<cfd::js::api::AddPubkeyHashSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            (&local_d8,(api *)request,(AddPubkeyHashSignRequestStruct *)&local_118,&local_f8,in_R8);
  RawTransactionResponseStruct::operator=(__return_storage_ptr__,&local_d8);
  RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_118);
  return __return_storage_ptr__;
}

Assistant:

RawTransactionResponseStruct ElementsTransactionStructApi::AddPubkeyHashSign(
    const AddPubkeyHashSignRequestStruct& request) {
  auto call_func = [](const AddPubkeyHashSignRequestStruct& request)
      -> RawTransactionResponseStruct {  // NOLINT
    RawTransactionResponseStruct response;

    ConfidentialTransactionContext ctx(request.tx);
    OutPoint outpoint(Txid(request.txin.txid), request.txin.vout);
    Pubkey pubkey(request.txin.pubkey);
    AddressType addr_type =
        AddressApiBase::ConvertAddressType(request.txin.hash_type);
    SigHashType sighashtype = TransactionStructApiBase::ConvertSigHashType(
        request.txin.sign_param.sighash_type,
        request.txin.sign_param.sighash_anyone_can_pay,
        request.txin.sign_param.sighash_rangeproof);
    SignParameter signature(
        ByteData(request.txin.sign_param.hex),
        request.txin.sign_param.der_encode, sighashtype);

    ctx.AddPubkeyHashSign(outpoint, signature, pubkey, addr_type);
    response.hex = ctx.GetHex();
    return response;
  };

  RawTransactionResponseStruct result;
  result = ExecuteStructApi<
      AddPubkeyHashSignRequestStruct, RawTransactionResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}